

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O2

int gdAffineTranslate(double *dst,double offset_x,double offset_y)

{
  *dst = 1.0;
  dst[1] = 0.0;
  dst[2] = 0.0;
  dst[3] = 1.0;
  dst[4] = offset_x;
  dst[5] = offset_y;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineTranslate (double dst[6], const double offset_x, const double offset_y)
{
	dst[0] = 1;
	dst[1] = 0;
	dst[2] = 0;
	dst[3] = 1;
	dst[4] = offset_x;
	dst[5] = offset_y;
    return GD_TRUE;
}